

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall soplex::SPxScaler<double>::unscale(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  int iVar2;
  SVectorBase<double> *pSVar3;
  int *piVar4;
  double *pdVar5;
  int __c;
  int __c_00;
  long in_RSI;
  Real RVar6;
  int j_1;
  int exp2_1;
  int exp1_1;
  SVectorBase<double> *vec_1;
  int i_1;
  int j;
  int exp2;
  int exp1;
  SVectorBase<double> *vec;
  int i;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  Real in_stack_ffffffffffffff28;
  SPxLPBase<double> *in_stack_ffffffffffffff30;
  undefined4 local_54;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_24;
  
  local_24 = 0;
  while( true ) {
    iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x299abf);
    if (iVar2 <= local_24) break;
    pSVar3 = SPxLPBase<double>::rowVector_w
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),local_24);
    local_3c = 0;
    while( true ) {
      iVar2 = SVectorBase<double>::size(pSVar3);
      if (iVar2 <= (int)local_3c) break;
      piVar4 = (int *)SVectorBase<double>::index(pSVar3,(char *)(ulong)local_3c,__c);
      DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0x178),*piVar4);
      SVectorBase<double>::value(pSVar3,local_3c);
      RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      pdVar5 = SVectorBase<double>::value(pSVar3,local_3c);
      *pdVar5 = RVar6;
      local_3c = local_3c + 1;
    }
    SPxLPBase<double>::maxRowObj
              (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                    );
    pdVar5 = SPxLPBase<double>::maxRowObj_w
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    *pdVar5 = RVar6;
    pdVar5 = SPxLPBase<double>::rhs
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar1 < *pdVar5) {
      SPxLPBase<double>::rhs_w
                (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      pdVar5 = SPxLPBase<double>::rhs_w
                         (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20))
      ;
      *pdVar5 = RVar6;
    }
    pdVar5 = SPxLPBase<double>::lhs
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar1) {
      SPxLPBase<double>::lhs_w
                (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      pdVar5 = SPxLPBase<double>::lhs_w
                         (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20))
      ;
      *pdVar5 = RVar6;
    }
    local_24 = local_24 + 1;
  }
  local_40 = 0;
  while( true ) {
    iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x299d6d);
    if (iVar2 <= local_40) break;
    pSVar3 = SPxLPBase<double>::colVector_w
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0x178),local_40);
    local_54 = 0;
    while( true ) {
      iVar2 = SVectorBase<double>::size(pSVar3);
      if (iVar2 <= (int)local_54) break;
      piVar4 = (int *)SVectorBase<double>::index(pSVar3,(char *)(ulong)local_54,__c_00);
      DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),*piVar4);
      SVectorBase<double>::value(pSVar3,local_54);
      RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      pdVar5 = SVectorBase<double>::value(pSVar3,local_54);
      *pdVar5 = RVar6;
      local_54 = local_54 + 1;
    }
    SPxLPBase<double>::maxObj_w
              (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                    );
    pdVar5 = SPxLPBase<double>::maxObj_w
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    *pdVar5 = RVar6;
    pdVar5 = SPxLPBase<double>::upper
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar1 < *pdVar5) {
      SPxLPBase<double>::upper_w
                (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      RVar6 = spxLdexp((Real)in_stack_ffffffffffffff30,
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      pdVar5 = SPxLPBase<double>::upper_w
                         (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20))
      ;
      *pdVar5 = RVar6;
    }
    pdVar5 = SPxLPBase<double>::lower
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    in_stack_ffffffffffffff30 = (SPxLPBase<double> *)*pdVar5;
    pdVar5 = (double *)infinity();
    iVar2 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if (-*pdVar5 < (double)in_stack_ffffffffffffff30) {
      SPxLPBase<double>::lower_w(in_stack_ffffffffffffff30,iVar2);
      in_stack_ffffffffffffff28 = spxLdexp((Real)in_stack_ffffffffffffff30,iVar2);
      pdVar5 = SPxLPBase<double>::lower_w
                         (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20))
      ;
      *pdVar5 = in_stack_ffffffffffffff28;
    }
    local_40 = local_40 + 1;
  }
  *(undefined1 *)(in_RSI + 0x1a0) = 0;
  return;
}

Assistant:

void SPxScaler<R>::unscale(SPxLPBase<R>& lp)
{
   assert(lp.isScaled());

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);

      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), -exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), -exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), -exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);

      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), -exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), exp2);
   }

   lp._isScaled = false;
   assert(lp.isConsistent());
}